

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::LookupParameters::g_squared_l2norm(LookupParameters *this,float *sqnorm)

{
  __node_base *p_Var1;
  float fVar2;
  RealScalar RVar3;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_40;
  
  p_Var1 = &(this->non_zero_grads)._M_h._M_before_begin;
  fVar2 = 0.0;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    Tensor::operator*(&local_40,
                      (this->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uint)*(size_type *)(p_Var1 + 1));
    RVar3 = Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
            ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)&local_40);
    fVar2 = fVar2 + RVar3;
  }
  *sqnorm = fVar2;
  return;
}

Assistant:

void LookupParameters::g_squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  bool acc = false;
  for (auto i : non_zero_grads) {
    gpu::l2_norm_reducer(grads[i].d.size(), grads[i].v, sqnorm, true, acc);
    acc = true;
  }
#else
  real a = 0;
  for (auto i : non_zero_grads)
    a += (*grads[i]).squaredNorm();
  *sqnorm = a;
#endif
}